

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListIndexedBy(Parse *pParse,SrcList *p,Token *pIndexedBy)

{
  char *pcVar1;
  int iVar2;
  SrcList_item *pItem;
  Token *pIndexedBy_local;
  SrcList *p_local;
  Parse *pParse_local;
  
  if ((p != (SrcList *)0x0) && (0 < p->nSrc)) {
    iVar2 = p->nSrc + -1;
    if ((pIndexedBy->n == 1) && (pIndexedBy->z == (char *)0x0)) {
      p->a[iVar2].field_0x39 = p->a[iVar2].field_0x39 & 0xfe | 1;
    }
    else {
      pcVar1 = sqlite3NameFromToken(pParse->db,pIndexedBy);
      p->a[iVar2].zIndex = pcVar1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListIndexedBy(Parse *pParse, SrcList *p, Token *pIndexedBy){
  assert( pIndexedBy!=0 );
  if( p && ALWAYS(p->nSrc>0) ){
    struct SrcList_item *pItem = &p->a[p->nSrc-1];
    assert( pItem->notIndexed==0 && pItem->zIndex==0 );
    if( pIndexedBy->n==1 && !pIndexedBy->z ){
      /* A "NOT INDEXED" clause was supplied. See parse.y 
      ** construct "indexed_opt" for details. */
      pItem->notIndexed = 1;
    }else{
      pItem->zIndex = sqlite3NameFromToken(pParse->db, pIndexedBy);
    }
  }
}